

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_schemas.cpp
# Opt level: O2

bool duckdb::DefaultSchemaGenerator::IsDefaultSchema(string *input_schema)

{
  char *__lhs;
  bool bVar1;
  long lVar2;
  string schema;
  string local_40;
  
  StringUtil::Lower(&local_40,(string *)input_schema);
  lVar2 = 0;
  do {
    __lhs = *(char **)((long)&internal_schemas + lVar2);
    if (lVar2 == 0x10) break;
    bVar1 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_40);
    lVar2 = lVar2 + 8;
  } while (!bVar1);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __lhs != (char *)0x0;
}

Assistant:

bool DefaultSchemaGenerator::IsDefaultSchema(const string &input_schema) {
	auto schema = StringUtil::Lower(input_schema);
	for (idx_t index = 0; internal_schemas[index].name != nullptr; index++) {
		if (internal_schemas[index].name == schema) {
			return true;
		}
	}
	return false;
}